

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarSimulate(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  Ssw_RarMan_t *p_00;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Vec_Int_t *pVVar8;
  Aig_Man_t *pAig_00;
  Abc_Cex_t *pAVar9;
  int local_b8;
  Vec_Int_t *local_98;
  long local_78;
  int Status;
  Aig_Man_t *pNewAig;
  int iFrameFail;
  int RetValue;
  int nSavedSeed;
  int nNumRestart;
  abctime timeLastSolved;
  abctime nTimeToStop;
  abctime clkTotal;
  abctime clk;
  int f;
  int r;
  Ssw_RarMan_t *p;
  int fMiter;
  int fTryBmc;
  Ssw_RarPars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  p._4_4_ = 0;
  p._0_4_ = 1;
  clk._0_4_ = -1;
  _fMiter = pPars;
  pPars_local = (Ssw_RarPars_t *)pAig;
  nTimeToStop = Abc_Clock();
  if (_fMiter->TimeOut == 0) {
    local_78 = 0;
  }
  else {
    iVar5 = _fMiter->TimeOut;
    aVar7 = Abc_Clock();
    local_78 = (long)iVar5 * 1000000 + aVar7;
  }
  timeLastSolved = local_78;
  _nSavedSeed = 0;
  RetValue = 0;
  iFrameFail = _fMiter->nRandSeed;
  pNewAig._4_4_ = -1;
  pNewAig._0_4_ = 0xffffffff;
  iVar5 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
  if (iVar5 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3da,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  iVar5 = Aig_ManConstrNum((Aig_Man_t *)pPars_local);
  if (iVar5 != 0) {
    __assert_fail("Aig_ManConstrNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3db,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  lVar2._0_4_ = pPars_local[4].TimeOut;
  lVar2._4_4_ = pPars_local[4].TimeOutGap;
  if (lVar2 != 0) {
    free(*(void **)&pPars_local[4].TimeOut);
    pPars_local[4].TimeOut = 0;
    pPars_local[4].TimeOutGap = 0;
  }
  if (_fMiter->fVerbose != 0) {
    Abc_Print(1,
              "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n"
              ,(ulong)(uint)_fMiter->nWords,(ulong)(uint)_fMiter->nFrames,
              (ulong)(uint)_fMiter->nRounds,(ulong)(uint)_fMiter->nRestart,_fMiter->nRandSeed,
              _fMiter->TimeOut);
  }
  Ssw_RarManPrepareRandom(iFrameFail);
  _f = Ssw_RarManStart((Aig_Man_t *)pPars_local,_fMiter);
  iVar5 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
  pVVar8 = Vec_IntStart(iVar5 * _fMiter->nWords);
  _f->vInits = pVVar8;
  _fMiter->nSolved = 0;
  _nSavedSeed = Abc_Clock();
  clk._4_4_ = 0;
  while( true ) {
    bVar4 = true;
    if (_fMiter->nRounds != 0) {
      bVar4 = RetValue * _fMiter->nRestart + clk._4_4_ < _fMiter->nRounds;
    }
    if (!bVar4) break;
    clkTotal = Abc_Clock();
    if (p._4_4_ != 0) {
      pAig_00 = Saig_ManDupWithPhase((Aig_Man_t *)pPars_local,_f->vInits);
      Saig_BmcPerform(pAig_00,0,100,2000,3,0,0,1,0,(int *)&pNewAig,0);
      Aig_ManStop(pAig_00);
    }
    for (clk._0_4_ = 0; (int)clk < _fMiter->nFrames; clk._0_4_ = (int)clk + 1) {
      if ((int)clk == 0) {
        local_98 = _f->vInits;
      }
      else {
        local_98 = (Vec_Int_t *)0x0;
      }
      Ssw_RarManSimulate(_f,local_98,0,0);
      p_00 = _f;
      if ((int)p != 0) {
        iVar5 = clk._4_4_ * _f->pPars->nFrames + (int)clk;
        aVar7 = Abc_Clock();
        iVar5 = Ssw_RarManCheckNonConstOutputs(p_00,iVar5,aVar7 - nTimeToStop);
        if (iVar5 == 2) {
          Abc_Print(1,"Quitting due to callback on fail.\n");
          goto LAB_007c98bc;
        }
        if (iVar5 == 1) {
          pNewAig._4_4_ = 0;
          if (_fMiter->fSolveAll == 0) {
            if (_fMiter->fVerbose != 0) {
              Abc_Print(1,"\n");
            }
            Ssw_RarManPrepareRandom(iFrameFail);
            if (_fMiter->fVerbose != 0) {
              Abc_Print(1,"Simulated %d frames for %d rounds with %d restarts.\n",
                        (ulong)(uint)_fMiter->nFrames,
                        (ulong)(uint)(RetValue * _fMiter->nRestart + clk._4_4_),
                        (ulong)(uint)RetValue);
            }
            pAVar9 = Ssw_RarDeriveCex(_f,clk._4_4_ * _f->pPars->nFrames + (int)clk,_f->iFailPo,
                                      _f->iFailPat,_fMiter->fVerbose);
            *(Abc_Cex_t **)&pPars_local[4].TimeOut = pAVar9;
            uVar3._0_4_ = pPars_local->nFrames;
            uVar3._4_4_ = pPars_local->nWords;
            Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)**(uint **)&pPars_local[4].TimeOut,uVar3,
                      (ulong)*(uint *)(*(long *)&pPars_local[4].TimeOut + 4));
            aVar7 = Abc_Clock();
            Abc_PrintTime(1,"Time",aVar7 - nTimeToStop);
            goto LAB_007c98bc;
          }
          _nSavedSeed = Abc_Clock();
        }
      }
      if ((_fMiter->TimeOut != 0) && (aVar7 = Abc_Clock(), timeLastSolved < aVar7)) {
        if (_fMiter->fSilent == 0) {
          if ((_fMiter->fVerbose != 0) && (_fMiter->fSolveAll == 0)) {
            Abc_Print(1,"\n");
          }
          Abc_Print(1,"Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ",
                    (ulong)(uint)_fMiter->nFrames,
                    (ulong)(uint)(RetValue * _fMiter->nRestart + clk._4_4_),(ulong)(uint)RetValue,
                    (ulong)(uint)_fMiter->nSolved);
          Abc_Print(1,"Reached timeout (%d sec).\n",(ulong)(uint)_fMiter->TimeOut);
        }
        goto LAB_007c98bc;
      }
      if (((_fMiter->TimeOutGap != 0) && (_nSavedSeed != 0)) &&
         (aVar7 = Abc_Clock(), _nSavedSeed + (long)_fMiter->TimeOutGap * 1000000 < aVar7)) {
        if (_fMiter->fSilent == 0) {
          if ((_fMiter->fVerbose != 0) && (_fMiter->fSolveAll == 0)) {
            Abc_Print(1,"\n");
          }
          Abc_Print(1,"Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ",
                    (ulong)(uint)_fMiter->nFrames,
                    (ulong)(uint)(RetValue * _fMiter->nRestart + clk._4_4_),(ulong)(uint)RetValue,
                    (ulong)(uint)_fMiter->nSolved);
          Abc_Print(1,"Reached gap timeout (%d sec).\n",(ulong)(uint)_fMiter->TimeOutGap);
        }
        goto LAB_007c98bc;
      }
      if (((_fMiter->fSolveAll != 0) && (_f->vCexes != (Vec_Ptr_t *)0x0)) &&
         (iVar5 = Vec_PtrCountZero(_f->vCexes), iVar5 == 0)) goto LAB_007c98bc;
    }
    if ((_fMiter->nRestart == 0) || (clk._4_4_ != _fMiter->nRestart)) {
      Ssw_RarTransferPatterns(_f,_f->vInits);
    }
    else {
      clk._4_4_ = -1;
      iFrameFail = (iFrameFail + 1) % 1000;
      Ssw_RarManPrepareRandom(iFrameFail);
      pVVar8 = _f->vInits;
      iVar5 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
      Vec_IntFill(pVVar8,iVar5 * _fMiter->nWords,0);
      RetValue = RetValue + 1;
      Vec_IntClear(_f->vPatBests);
    }
    if (_fMiter->fVerbose != 0) {
      if (_fMiter->fSolveAll == 0) {
        Abc_Print(1,".");
      }
      else {
        Abc_Print(1,"Starts =%6d   ",(ulong)(uint)RetValue);
        if (clk._4_4_ == -1) {
          local_b8 = 0;
        }
        else {
          local_b8 = clk._4_4_;
        }
        Abc_Print(1,"Rounds =%6d   ",(ulong)(uint)(RetValue * _fMiter->nRestart + local_b8));
        Abc_Print(1,"Frames =%6d   ",
                  (ulong)(uint)((RetValue * _fMiter->nRestart + clk._4_4_) * _fMiter->nFrames));
        uVar1 = _fMiter->nSolved;
        iVar5 = _fMiter->nSolved;
        iVar6 = Saig_ManPoNum(_f->pAig);
        Abc_Print(1,"CEX =%6d (%6.2f %%)   ",((double)iVar5 * 100.0) / (double)iVar6,(ulong)uVar1);
        aVar7 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar7 - nTimeToStop);
      }
    }
    clk._4_4_ = clk._4_4_ + 1;
  }
LAB_007c98bc:
  if ((_fMiter->fSetLastState != 0) && (_f->vInits != (Vec_Int_t *)0x0)) {
    iVar5 = Vec_IntSize(_f->vInits);
    iVar6 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
    if (iVar5 % iVar6 != 0) {
      __assert_fail("Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x455,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
    }
    pVVar8 = _f->vInits;
    iVar5 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
    Vec_IntShrink(pVVar8,iVar5);
    *(Vec_Int_t **)&pPars_local[3].nBinSize = _f->vInits;
    _f->vInits = (Vec_Int_t *)0x0;
  }
  if ((((_fMiter->nSolved == 0) && (clk._4_4_ == _fMiter->nRounds)) &&
      ((int)clk == _fMiter->nFrames)) && (_fMiter->fSilent == 0)) {
    if (_fMiter->fVerbose != 0) {
      Abc_Print(1,"\n");
    }
    Abc_Print(1,"Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ",
              (ulong)(uint)_fMiter->nFrames,(ulong)(uint)(RetValue * _fMiter->nRestart + clk._4_4_),
              (ulong)(uint)RetValue);
    aVar7 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar7 - nTimeToStop);
  }
  Ssw_RarManStop(_f);
  return pNewAig._4_4_;
}

Assistant:

int Ssw_RarSimulate( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    int fTryBmc = 0;
    int fMiter = 1;
    Ssw_RarMan_t * p;
    int r, f = -1;
    abctime clk, clkTotal = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime timeLastSolved = 0;
    int nNumRestart = 0;
    int nSavedSeed = pPars->nRandSeed;
    int RetValue = -1;
    int iFrameFail = -1;
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManConstrNum(pAig) == 0 );
    ABC_FREE( pAig->pSeqModel );
    // consider the case of empty AIG
//    if ( Aig_ManNodeNum(pAig) == 0 )
//        return -1;
    // check trivially SAT miters
//    if ( fMiter && Ssw_RarCheckTrivial( pAig, fVerbose ) )
//        return 0;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n",
            pPars->nWords, pPars->nFrames, pPars->nRounds, pPars->nRestart, pPars->nRandSeed, pPars->TimeOut );
    // reset random numbers
    Ssw_RarManPrepareRandom( nSavedSeed );

    // create manager
    p = Ssw_RarManStart( pAig, pPars );
    p->vInits = Vec_IntStart( Aig_ManRegNum(pAig) * pPars->nWords );

    // perform simulation rounds
    pPars->nSolved = 0;
    timeLastSolved = Abc_Clock();
    for ( r = 0; !pPars->nRounds || (nNumRestart * pPars->nRestart + r < pPars->nRounds); r++ )
    {
        clk = Abc_Clock();
        if ( fTryBmc )
        {
            Aig_Man_t * pNewAig = Saig_ManDupWithPhase( pAig, p->vInits );
            Saig_BmcPerform( pNewAig, 0, 100, 2000, 3, 0, 0, 1 /*fVerbose*/, 0, &iFrameFail, 0 );
//            if ( pNewAig->pSeqModel != NULL )
//                Abc_Print( 1, "BMC has found a counter-example in frame %d.\n", iFrameFail );
            Aig_ManStop( pNewAig );
        }
        // simulate
        for ( f = 0; f < pPars->nFrames; f++ )
        {
            Ssw_RarManSimulate( p, f ? NULL : p->vInits, 0, 0 );
            if ( fMiter )
            {
                int Status = Ssw_RarManCheckNonConstOutputs(p, r * p->pPars->nFrames + f, Abc_Clock() - clkTotal);
                if ( Status == 2 )
                {
                    Abc_Print( 1, "Quitting due to callback on fail.\n" );
                    goto finish;
                }
                if ( Status == 1 ) // found CEX
                {
                    RetValue = 0;
                    if ( !pPars->fSolveAll )
                    {
                        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        //                Abc_Print( 1, "Simulation asserted a PO in frame f: %d <= f < %d.\n", r * nFrames, (r+1) * nFrames );
                        Ssw_RarManPrepareRandom( nSavedSeed );
                        if ( pPars->fVerbose )
                            Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.\n", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                        pAig->pSeqModel = Ssw_RarDeriveCex( p, r * p->pPars->nFrames + f, p->iFailPo, p->iFailPat, pPars->fVerbose );
                        // print final report
                        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pAig->pSeqModel->iPo, pAig->pName, pAig->pSeqModel->iFrame );
                        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
                        goto finish;
                    }
                    timeLastSolved = Abc_Clock();
                }
                // else - did not find a counter example
            }
            // check timeout
            if ( pPars->TimeOut && Abc_Clock() > nTimeToStop )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached timeout (%d sec).\n",  pPars->TimeOut );
                }
                goto finish;
            }
            if ( pPars->TimeOutGap && timeLastSolved && Abc_Clock() > timeLastSolved + pPars->TimeOutGap * CLOCKS_PER_SEC )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached gap timeout (%d sec).\n",  pPars->TimeOutGap );
                }
                goto finish;
            }
            // check if all outputs are solved by now
            if ( pPars->fSolveAll && p->vCexes && Vec_PtrCountZero(p->vCexes) == 0 )
                goto finish;
        }
        // get initialization patterns
        if ( pPars->nRestart && r == pPars->nRestart )
        {
            r = -1;
            nSavedSeed = (nSavedSeed + 1) % 1000;
            Ssw_RarManPrepareRandom( nSavedSeed );
            Vec_IntFill( p->vInits, Aig_ManRegNum(pAig) * pPars->nWords, 0 );
            nNumRestart++;
            Vec_IntClear( p->vPatBests );
            // clean rarity info
//            memset( p->pRarity, 0, sizeof(int) * (1 << nBinSize) * p->nGroups );
        }
        else
            Ssw_RarTransferPatterns( p, p->vInits );
        // printout
        if ( pPars->fVerbose )
        {
            if ( pPars->fSolveAll )
            {
                Abc_Print( 1, "Starts =%6d   ",  nNumRestart );
                Abc_Print( 1, "Rounds =%6d   ",  nNumRestart * pPars->nRestart + ((r==-1)?0:r) );
                Abc_Print( 1, "Frames =%6d   ", (nNumRestart * pPars->nRestart + r) * pPars->nFrames );
                Abc_Print( 1, "CEX =%6d (%6.2f %%)   ", pPars->nSolved, 100.0*pPars->nSolved/Saig_ManPoNum(p->pAig) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
            }
            else
                Abc_Print( 1, "." );
        }

    }
finish:
    if ( pPars->fSetLastState && p->vInits )
    {
        assert( Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0 );
        Vec_IntShrink( p->vInits, Aig_ManRegNum(pAig) );
        pAig->pData = p->vInits;  p->vInits = NULL;
    }
    if ( pPars->nSolved )
    {
/*
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts asserted %d (out of %d) POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved, Saig_ManPoNum(p->pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
*/
    }
    else if ( r == pPars->nRounds && f == pPars->nFrames )
    {
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
    }
    // cleanup
    Ssw_RarManStop( p );
    return RetValue;
}